

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O0

void __thiscall tst_helpers_resolve::voidFuture(tst_helpers_resolve *this)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  anon_class_1_0_00000001_for__M_head_impl *in_RDX;
  anon_class_1_0_00000001_for__M_head_impl *f;
  initializer_list<QtPromise::QPromise<void>_> *local_1f0;
  initializer_list<QtPromise::QPromise<void>_> *local_1a8;
  int local_170 [2];
  const_iterator local_168;
  QPromise<void> *promise_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  initializer_list<QtPromise::QPromise<void>_> local_148;
  QPromise<void> local_138;
  QPromise<void> local_128;
  initializer_list<QtPromise::QPromise<void>_> local_118;
  initializer_list<QtPromise::QPromise<void>_> *local_108;
  initializer_list<QtPromise::QPromise<void>_> *__range1_1;
  const_iterator local_f8;
  QPromise<void> *promise;
  const_iterator local_e8;
  const_iterator __end1;
  const_iterator __begin1;
  initializer_list<QtPromise::QPromise<void>_> local_d0;
  QPromise<void> local_c0;
  QPromise<void> local_b0;
  initializer_list<QtPromise::QPromise<void>_> local_a0;
  initializer_list<QtPromise::QPromise<void>_> *local_90;
  initializer_list<QtPromise::QPromise<void>_> *__range1;
  Type p2;
  Type p1;
  undefined1 local_58 [8];
  Type p0;
  undefined1 local_38 [8];
  QFuture<void> v1;
  QFuture<void> v0;
  anon_class_1_0_00000001_for__M_head_impl fn;
  tst_helpers_resolve *this_local;
  
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>
            ((QFuture<void> *)&v1.field_0x8,(QtConcurrent *)&v0.field_0xf,in_RDX);
  QFuture<void>::QFuture((QFuture<void> *)local_38,(QFuture<void> *)&v1.field_0x8);
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>
            ((QFuture<void> *)&p1.super_QPromiseBase<void>.m_d,(QtConcurrent *)&v0.field_0xf,f);
  QtPromise::resolve<QFuture<void>>
            ((QtPromise *)local_58,(QFuture<void> *)&p1.super_QPromiseBase<void>.m_d);
  QFuture<void>::~QFuture((QFuture<void> *)&p1.super_QPromiseBase<void>.m_d);
  QtPromise::resolve<QFuture<void>&>
            ((QtPromise *)&p2.super_QPromiseBase<void>.m_d,(QFuture<void> *)&v1.field_0x8);
  QtPromise::resolve<QFuture<void>const&>((QtPromise *)&__range1,(QFuture<void> *)local_38);
  __begin1 = (const_iterator)&local_d0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (__begin1,(QPromise<void> *)local_58);
  __begin1 = &local_c0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (__begin1,(QPromise<void> *)&p2.super_QPromiseBase<void>.m_d);
  __begin1 = &local_b0;
  QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
            (__begin1,(QPromise<void> *)&__range1);
  local_a0._M_array = (iterator)&local_d0;
  local_a0._M_len = 3;
  local_90 = &local_a0;
  __end1 = std::initializer_list<QtPromise::QPromise<void>_>::begin(local_90);
  local_e8 = std::initializer_list<QtPromise::QPromise<void>_>::end(local_90);
  for (; __end1 != local_e8; __end1 = __end1 + 1) {
    local_f8 = __end1;
    __range1_1._7_1_ = QtPromise::QPromiseBase<void>::isPending(&__end1->super_QPromiseBase<void>);
    __range1_1._6_1_ = 1;
    bVar1 = QTest::qCompare<bool,bool>
                      ((bool *)((long)&__range1_1 + 7),(bool *)((long)&__range1_1 + 6),
                       "promise.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                       ,0x10e);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      promise._4_4_ = 1;
      goto LAB_0010956a;
    }
  }
  promise._4_4_ = 2;
LAB_0010956a:
  local_1a8 = &local_a0;
  do {
    local_1a8 = local_1a8 + -1;
    QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_1a8);
  } while (local_1a8 != &local_d0);
  if (promise._4_4_ == 2) {
    __begin1_1 = (const_iterator)&local_148;
    QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
              (__begin1_1,(QPromise<void> *)local_58);
    __begin1_1 = &local_138;
    QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
              (__begin1_1,(QPromise<void> *)&p2.super_QPromiseBase<void>.m_d);
    __begin1_1 = &local_128;
    QtPromise::QPromise<void>::QPromise<QtPromise::QPromise<void>&>
              (__begin1_1,(QPromise<void> *)&__range1);
    local_118._M_array = (iterator)&local_148;
    local_118._M_len = 3;
    local_108 = &local_118;
    __end1_1 = std::initializer_list<QtPromise::QPromise<void>_>::begin(local_108);
    promise_1 = std::initializer_list<QtPromise::QPromise<void>_>::end(local_108);
    for (; __end1_1 != promise_1; __end1_1 = __end1_1 + 1) {
      local_168 = __end1_1;
      local_170[1] = 0xffffffff;
      local_170[0] = 0x2a;
      iVar3 = waitForValue<int>(__end1_1,local_170 + 1,local_170);
      bVar2 = QTest::qCompare(iVar3,0x2a,"waitForValue(promise, -1, 42)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                              ,0x111);
      if (((bVar2 ^ 0xff) & 1) != 0) {
        promise._4_4_ = 1;
        goto LAB_001097e2;
      }
    }
    promise._4_4_ = 6;
LAB_001097e2:
    local_1f0 = &local_118;
    do {
      local_1f0 = local_1f0 + -1;
      QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_1f0);
    } while (local_1f0 != &local_148);
    if (promise._4_4_ == 6) {
      promise._4_4_ = 0;
    }
  }
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&__range1);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)&p2.super_QPromiseBase<void>.m_d);
  QtPromise::QPromise<void>::~QPromise((QPromise<void> *)local_58);
  QFuture<void>::~QFuture((QFuture<void> *)local_38);
  QFuture<void>::~QFuture((QFuture<void> *)&v1.field_0x8);
  return;
}

Assistant:

void tst_helpers_resolve::voidFuture()
{
    auto fn = []() {};
    QFuture<void> v0 = QtConcurrent::run(fn);
    const QFuture<void> v1 = v0;

    auto p0 = QtPromise::resolve(QtConcurrent::run(fn));
    auto p1 = QtPromise::resolve(v0);
    auto p2 = QtPromise::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<void>>::value));

    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(promise.isPending(), true);
    }
    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(waitForValue(promise, -1, 42), 42);
    }
}